

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O0

int32 next_prime(uint32 n)

{
  double dVar1;
  uint local_18;
  uint local_14;
  uint32 l;
  uint32 f;
  uint32 b;
  uint32 n_local;
  
  local_18 = n;
  do {
    dVar1 = sqrt((double)local_18);
    dVar1 = ceil(dVar1);
    for (local_14 = 2; local_14 < (uint)(long)dVar1; local_14 = local_14 + 1) {
      if ((local_18 / local_14) * local_14 == local_18) {
        local_18 = local_18 + 1;
        break;
      }
    }
    if (local_14 == (uint)(long)dVar1) {
      return local_18;
    }
    if (local_18 == n) {
      fprintf(_stderr,"next_prime: failed to find next prime for %d\n",(ulong)n);
      return local_18;
    }
  } while( true );
}

Assistant:

static int32
next_prime(uint32 n)
{
    uint32 b;
    uint32 f;
    uint32 l;

    l = n;

    while (1) {
	b = ceil(sqrt((double)l));

	for (f = 2; f < b; f++) {
	    if ((l/f)*f == l) {
		++l;
		break;
	    }
	}

	if (f == b)
	    break;
	if (l == n)
	{
	    fprintf(stderr,"next_prime: failed to find next prime for %d\n",
		    n);
	    break;
	}
    }

    return l;
}